

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::IsGeneratorAndJitIsDisabled(FunctionBody *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = FunctionProxy::IsCoroutine((FunctionProxy *)this);
  if (bVar1) {
    bVar1 = true;
    if ((DAT_01436248 == '\x01') &&
       (((this->super_ParseableFunctionInfo).flags & Flags_HasTry) == Flags_None)) {
      bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)this);
      if (!bVar2) {
        bVar1 = FunctionProxy::IsModule((FunctionProxy *)this);
        return bVar1;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
    FunctionBody::IsGeneratorAndJitIsDisabled() const
    {
        return this->IsCoroutine() && !(CONFIG_FLAG(JitES6Generators) && !this->GetHasTry() && !this->IsInDebugMode() && !this->IsModule());
    }